

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::buildIf(TranslateToFuzzReader *this,ThreeArgs *args,Type type)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pEVar1 = args->c;
  pEVar2 = args->a;
  pEVar3 = args->b;
  pEVar4 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8)
  ;
  pEVar4->_id = IfId;
  (pEVar4->type).id = 0;
  local_38 = SUB84(pEVar2,0);
  uStack_34 = (undefined4)((ulong)pEVar2 >> 0x20);
  uStack_30 = SUB84(pEVar3,0);
  uStack_2c = (undefined4)((ulong)pEVar3 >> 0x20);
  *(undefined4 *)(pEVar4 + 1) = local_38;
  *(undefined4 *)&pEVar4[1].field_0x4 = uStack_34;
  *(undefined4 *)&pEVar4[1].type.id = uStack_30;
  *(undefined4 *)((long)&pEVar4[1].type.id + 4) = uStack_2c;
  *(Expression **)(pEVar4 + 2) = pEVar1;
  wasm::If::finalize(pEVar4,type.id,1);
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::buildIf(const struct ThreeArgs& args,
                                           Type type) {
  return builder.makeIf(args.a, args.b, args.c, type);
}